

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::CreateImportedGenerationObjects
          (cmGlobalGenerator *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   *exports)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pbVar4;
  cmGeneratorTarget *in_RAX;
  pointer puVar5;
  long lVar6;
  long lVar7;
  pointer puVar8;
  string *t;
  pointer name;
  cmGeneratorTarget *gt;
  
  gt = in_RAX;
  CreateGenerationObjects(this,ImportedOnly);
  puVar1 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)puVar2 - (long)puVar1;
  puVar5 = puVar1;
  for (lVar7 = lVar6 >> 5; 0 < lVar7; lVar7 = lVar7 + -1) {
    puVar8 = puVar5;
    if ((puVar5->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
        super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
        super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) goto LAB_0041b532;
    if (puVar5[1]._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
        super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
        super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) {
      puVar8 = puVar5 + 1;
      goto LAB_0041b532;
    }
    if (puVar5[2]._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
        super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
        super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) {
      puVar8 = puVar5 + 2;
      goto LAB_0041b532;
    }
    if (puVar5[3]._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
        super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
        super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) {
      puVar8 = puVar5 + 3;
      goto LAB_0041b532;
    }
    puVar5 = puVar5 + 4;
    lVar6 = lVar6 + -0x20;
  }
  lVar6 = lVar6 >> 3;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      puVar8 = puVar2;
      if ((lVar6 != 3) ||
         (puVar8 = puVar5,
         (puVar5->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
         super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
         super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf)) goto LAB_0041b532;
      puVar5 = puVar5 + 1;
    }
    puVar8 = puVar5;
    if ((puVar5->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
        super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
        super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) goto LAB_0041b532;
    puVar5 = puVar5 + 1;
  }
  puVar8 = puVar2;
  if ((puVar5->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
      super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) {
    puVar8 = puVar5;
  }
LAB_0041b532:
  puVar3 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (targets->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (name = (targets->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; name != pbVar4; name = name + 1) {
    gt = cmLocalGenerator::FindGeneratorTargetToUse
                   (*(cmLocalGenerator **)((long)puVar8 + ((long)puVar3 - (long)puVar1)),name);
    if (gt != (cmGeneratorTarget *)0x0) {
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
                (exports,&gt);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateImportedGenerationObjects(
  cmMakefile* mf, const std::vector<std::string>& targets,
  std::vector<const cmGeneratorTarget*>& exports)
{
  this->CreateGenerationObjects(ImportedOnly);
  auto const mfit =
    std::find_if(this->Makefiles.begin(), this->Makefiles.end(),
                 [mf](const std::unique_ptr<cmMakefile>& item) {
                   return item.get() == mf;
                 });
  auto& lg =
    this->LocalGenerators[std::distance(this->Makefiles.begin(), mfit)];
  for (std::string const& t : targets) {
    cmGeneratorTarget* gt = lg->FindGeneratorTargetToUse(t);
    if (gt) {
      exports.push_back(gt);
    }
  }
}